

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O0

shared_ptr<const_calc4::Operator>
calc4::Optimize<__int128>(CompilationContext *context,shared_ptr<const_calc4::Operator> *op)

{
  bool bVar1;
  pointer ppVar2;
  OperatorImplement *this;
  OperatorDefinition *in_RSI;
  OperatorImplement *in_RDI;
  shared_ptr<const_calc4::Operator> sVar3;
  CompilationContext *unaff_retaddr;
  shared_ptr<const_calc4::Operator> optimized;
  const_iterator it;
  undefined8 in_stack_ffffffffffffff48;
  OperatorImplement *this_00;
  int iVar4;
  undefined8 definition;
  shared_ptr<const_calc4::Operator> *in_stack_ffffffffffffff80;
  CompilationContext *in_stack_ffffffffffffff88;
  _Self local_28;
  const_iterator local_20;
  undefined8 local_10;
  undefined8 implement;
  
  local_10 = in_RSI;
  implement = in_RDI;
  local_20 = CompilationContext::UserDefinedOperatorBegin_abi_cxx11_
                       ((CompilationContext *)in_stack_ffffffffffffff48);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         CompilationContext::UserDefinedOperatorEnd_abi_cxx11_
                   ((CompilationContext *)in_stack_ffffffffffffff48);
    bVar1 = std::operator!=(&stack0xffffffffffffffe0,&local_28);
    if (!bVar1) break;
    this_00 = (OperatorImplement *)&stack0xffffffffffffffe0;
    in_stack_ffffffffffffff48 = local_10;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
                           *)0x142672);
    OperatorImplement::GetOperator(&ppVar2->second);
    anon_unknown_23::OptimizeCore<__int128>(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    definition = local_10;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
                           *)0x1426a9);
    this = (OperatorImplement *)OperatorImplement::GetDefinition(&ppVar2->second);
    OperatorImplement::OperatorImplement
              (this,(OperatorDefinition *)definition,(shared_ptr<const_calc4::Operator> *)this_00);
    CompilationContext::AddOperatorImplement(unaff_retaddr,(OperatorImplement *)implement);
    OperatorImplement::~OperatorImplement(this_00);
    iVar4 = (int)((ulong)this_00 >> 0x20);
    std::shared_ptr<const_calc4::Operator>::~shared_ptr
              ((shared_ptr<const_calc4::Operator> *)0x1426fd);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
                  *)definition,iVar4);
  }
  sVar3 = anon_unknown_23::OptimizeCore<__int128>
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  sVar3.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<const_calc4::Operator>)
         sVar3.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Operator> Optimize(CompilationContext& context,
                                         const std::shared_ptr<const Operator>& op)
{
    for (auto it = context.UserDefinedOperatorBegin(); it != context.UserDefinedOperatorEnd(); it++)
    {
        std::shared_ptr<const Operator> optimized =
            OptimizeCore<TNumber>(context, it->second.GetOperator());
        context.AddOperatorImplement(
            OperatorImplement(it->second.GetDefinition(), std::move(optimized)));
    }

    return OptimizeCore<TNumber>(context, op);
}